

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForMutable
          (FileGenerator *this,Printer *printer)

{
  ClassNameResolver *this_00;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *this_01;
  MessageGenerator *pMVar1;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *this_02;
  ExtensionGenerator *pEVar2;
  FileDescriptor *pFVar3;
  undefined1 in_CL;
  int i_2;
  int index;
  int i;
  long lVar4;
  string dependency;
  FieldDescriptorSet extensions;
  string file_data;
  FileDescriptorProto file_proto;
  
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static final com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                    );
  io::Printer::Indent(printer);
  FileJavaPackage_abi_cxx11_
            ((string *)&file_proto,(java *)this->file_,(FileDescriptor *)0x1,(bool)in_CL);
  ClassNameResolver::GetDescriptorClassName_abi_cxx11_
            ((string *)&extensions,this->name_resolver_,this->file_);
  io::Printer::Print(printer,"descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n"
                     ,"immutable_package",(string *)&file_proto,"descriptor_classname",
                     (string *)&extensions);
  std::__cxx11::string::~string((string *)&extensions);
  std::__cxx11::string::~string((string *)&file_proto);
  for (lVar4 = 0; pFVar3 = this->file_, lVar4 < *(int *)(pFVar3 + 0x58); lVar4 = lVar4 + 1) {
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,lVar4);
    pMVar1 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (this_01);
    (*pMVar1->_vptr_MessageGenerator[3])(pMVar1,printer);
  }
  for (lVar4 = 0; lVar4 < *(int *)(pFVar3 + 0x88); lVar4 = lVar4 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar4);
    pEVar2 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (this_02);
    (*pEVar2->_vptr_ExtensionGenerator[3])(pEVar2,printer);
    pFVar3 = this->file_;
  }
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  FileDescriptor::CopyTo(this->file_,&file_proto);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&file_proto,&file_data);
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &extensions._M_t._M_impl.super__Rb_tree_header._M_header;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  anon_unknown_0::CollectExtensions
            (&file_proto,*(DescriptorPool **)(this->file_ + 0x10),&extensions,&file_data);
  if (extensions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&dependency,this->name_resolver_,this->file_);
    io::Printer::Print(printer,
                       "try {\n  java.lang.Class immutableClass = java.lang.Class.forName(\n      \"$immutable_classname$\");\n} catch (java.lang.ClassNotFoundException e) {\n}\n"
                       ,"immutable_classname",&dependency);
    std::__cxx11::string::~string((string *)&dependency);
  }
  for (index = 0; index < *(int *)(this->file_ + 0x18); index = index + 1) {
    FileDescriptor::dependency(this->file_,index);
    this_00 = this->name_resolver_;
    pFVar3 = FileDescriptor::dependency(this->file_,index);
    ClassNameResolver::GetMutableClassName<google::protobuf::FileDescriptor>
              (&dependency,this_00,pFVar3);
    io::Printer::Print(printer,"$dependency$.getDescriptor();\n","dependency",&dependency);
    std::__cxx11::string::~string((string *)&dependency);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~set(&extensions);
  std::__cxx11::string::~string((string *)&file_data);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForMutable(io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static final com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n");
  printer->Indent();

  printer->Print(
    "descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n",
    "immutable_package", FileJavaPackage(file_, true),
    "descriptor_classname", name_resolver_->GetDescriptorClassName(file_));

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariableInitializers(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
  }

  // Check if custom options exist. If any, try to load immutable classes since
  // custom options are only represented with immutable messages.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Try to load immutable messages' outer class. Its initialization code
    // will take care of interpreting custom options.
    printer->Print(
      "try {\n"
      // Note that we have to load the immutable class dynamically here as
      // we want the mutable code to be independent from the immutable code
      // at compile time. It is required to implement dual-compile for
      // mutable and immutable API in blaze.
      "  java.lang.Class immutableClass = java.lang.Class.forName(\n"
      "      \"$immutable_classname$\");\n"
      "} catch (java.lang.ClassNotFoundException e) {\n"
      // The immutable class can not be found. Custom options are left
      // as unknown fields.
      // TODO(xiaofeng): inform the user with a warning?
      "}\n",
      "immutable_classname", name_resolver_->GetImmutableClassName(file_));
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), false)) {
      string dependency = name_resolver_->GetMutableClassName(
          file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}